

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_sched.cpp
# Opt level: O0

void __kmp_dist_for_static_init<int>
               (ident_t *loc,kmp_int32 gtid,kmp_int32 schedule,kmp_int32 *plastiter,int *plower,
               int *pupper,int *pupperDist,signed_t *pstride,signed_t incr,signed_t chunk)

{
  uint uVar1;
  kmp_info_t *pkVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint *in_RCX;
  int in_EDX;
  uint uVar8;
  int in_ESI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  ST span;
  int upper_1;
  int chunk_inc_count_1;
  UT extras_1;
  UT chunkL;
  int upper;
  int chunk_inc_count;
  UT extras;
  UT chunkD;
  kmp_info_t *th;
  kmp_team_t *team;
  UT trip_count;
  kmp_uint32 nteams;
  kmp_uint32 team_id;
  kmp_uint32 nth;
  kmp_uint32 tid;
  uint local_ac;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  cons_type in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  bool local_92;
  bool local_91;
  uint local_8c;
  uint local_84;
  bool local_75;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  uint local_3c;
  
  if (__kmp_env_consistency_check != 0) {
    __kmp_push_workshare
              (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
               (ident_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (in_stack_00000018 == 0) {
      __kmp_error_construct
                ((kmp_i18n_id_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (cons_type)in_stack_ffffffffffffffb0,
                 (ident_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    if ((int)in_stack_00000018 < 1) {
      if (*in_R9 <= *in_R8) goto LAB_001aba3e;
    }
    else if (*in_R8 <= *in_R9) goto LAB_001aba3e;
    __kmp_error_construct
              ((kmp_i18n_id_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               (cons_type)in_stack_ffffffffffffffb0,
               (ident_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
LAB_001aba3e:
  uVar3 = __kmp_tid_from_gtid(in_ESI);
  pkVar2 = __kmp_threads[in_ESI];
  uVar1 = (pkVar2->th).th_team_nproc;
  uVar5 = (pkVar2->th).th_teams_size.nteams;
  uVar8 = (((pkVar2->th).th_team)->t).t_master_tid;
  if (in_stack_00000018 == 1) {
    uVar4 = *in_R9 - *in_R8;
  }
  else if (in_stack_00000018 == 0xffffffff) {
    uVar4 = *in_R8 - *in_R9;
  }
  else if ((int)in_stack_00000018 < 1) {
    uVar4 = (uint)(*in_R8 - *in_R9) / -in_stack_00000018;
  }
  else {
    uVar4 = (uint)(*in_R9 - *in_R8) / in_stack_00000018;
  }
  local_3c = uVar4 + 1;
  *in_stack_00000010 = *in_R9 - *in_R8;
  if (local_3c <= uVar5) {
    if ((uVar8 < local_3c) && (uVar3 == 0)) {
      iVar7 = *in_R8 + uVar8 * in_stack_00000018;
      *in_R8 = iVar7;
      *in_stack_00000008 = iVar7;
      *in_R9 = iVar7;
    }
    else {
      *in_stack_00000008 = *in_R9;
      *in_R8 = *in_R9 + in_stack_00000018;
    }
    if (in_RCX == (uint *)0x0) {
      return;
    }
    local_75 = uVar3 == 0 && uVar8 == uVar4;
    *in_RCX = (uint)local_75;
    return;
  }
  if (__kmp_static == kmp_sch_static_balanced) {
    uVar4 = local_3c % uVar5;
    local_84 = uVar4;
    if (uVar8 < uVar4) {
      local_84 = uVar8;
    }
    *in_R8 = in_stack_00000018 * (uVar8 * (local_3c / uVar5) + local_84) + *in_R8;
    if (uVar8 < uVar4) {
      local_8c = 0;
    }
    else {
      local_8c = in_stack_00000018;
    }
    *in_stack_00000008 = (*in_R8 + (local_3c / uVar5) * in_stack_00000018) - local_8c;
    if (in_RCX != (uint *)0x0) {
      *in_RCX = (uint)(uVar8 == uVar5 - 1);
    }
  }
  else {
    iVar6 = (local_3c / uVar5 + (uint)(local_3c % uVar5 != 0)) * in_stack_00000018;
    iVar7 = *in_R9;
    *in_R8 = uVar8 * iVar6 + *in_R8;
    *in_stack_00000008 = (*in_R8 + iVar6) - in_stack_00000018;
    if ((int)in_stack_00000018 < 1) {
      if (*in_R8 < *in_stack_00000008) {
        *in_stack_00000008 = -0x80000000;
      }
      if (in_RCX != (uint *)0x0) {
        local_92 = false;
        if (iVar7 <= *in_R8) {
          local_92 = *in_stack_00000008 < (int)(iVar7 - in_stack_00000018);
        }
        *in_RCX = (uint)local_92;
      }
      if (*in_stack_00000008 < iVar7) {
        *in_stack_00000008 = iVar7;
      }
      if (*in_R8 < *in_stack_00000008) {
        *in_R9 = *in_stack_00000008;
        return;
      }
    }
    else {
      if (*in_stack_00000008 < *in_R8) {
        *in_stack_00000008 = 0x7fffffff;
      }
      if (in_RCX != (uint *)0x0) {
        local_91 = false;
        if (*in_R8 <= iVar7) {
          local_91 = (int)(iVar7 - in_stack_00000018) < *in_stack_00000008;
        }
        *in_RCX = (uint)local_91;
      }
      if (iVar7 < *in_stack_00000008) {
        *in_stack_00000008 = iVar7;
      }
      if (*in_stack_00000008 < *in_R8) {
        *in_R9 = *in_stack_00000008;
        return;
      }
    }
  }
  if (in_stack_00000018 == 1) {
    uVar5 = *in_stack_00000008 - *in_R8;
  }
  else if (in_stack_00000018 == 0xffffffff) {
    uVar5 = *in_R8 - *in_stack_00000008;
  }
  else if ((int)in_stack_00000018 < 2) {
    uVar5 = (uint)(*in_R8 - *in_stack_00000008) / -in_stack_00000018;
  }
  else {
    uVar5 = (uint)(*in_stack_00000008 - *in_R8) / in_stack_00000018;
  }
  local_3c = uVar5 + 1;
  if (in_EDX == 0x21) {
    if ((int)in_stack_00000020 < 1) {
      in_stack_00000020 = 1;
    }
    iVar7 = in_stack_00000020 * in_stack_00000018;
    *in_stack_00000010 = iVar7 * uVar1;
    *in_R8 = *in_R8 + iVar7 * uVar3;
    *in_R9 = (*in_R8 + iVar7) - in_stack_00000018;
    if (((in_RCX != (uint *)0x0) && (*in_RCX != 0)) &&
       (uVar3 != (uint)(((ulong)uVar5 / (ulong)in_stack_00000020) % (ulong)uVar1))) {
      *in_RCX = 0;
    }
  }
  else if (in_EDX == 0x22) {
    if (uVar1 < local_3c) {
      if (__kmp_static == kmp_sch_static_balanced) {
        uVar8 = local_3c % uVar1;
        uVar5 = uVar8;
        if (uVar3 < uVar8) {
          uVar5 = uVar3;
        }
        *in_R8 = in_stack_00000018 * (uVar3 * (local_3c / uVar1) + uVar5) + *in_R8;
        if (uVar3 < uVar8) {
          local_ac = 0;
        }
        else {
          local_ac = in_stack_00000018;
        }
        *in_R9 = (*in_R8 + (local_3c / uVar1) * in_stack_00000018) - local_ac;
        if (((in_RCX != (uint *)0x0) && (*in_RCX != 0)) && (uVar3 != uVar1 - 1)) {
          *in_RCX = 0;
        }
      }
      else {
        iVar6 = (local_3c / uVar1 + (uint)(local_3c % uVar1 != 0)) * in_stack_00000018;
        iVar7 = *in_stack_00000008;
        *in_R8 = uVar3 * iVar6 + *in_R8;
        *in_R9 = (*in_R8 + iVar6) - in_stack_00000018;
        if ((int)in_stack_00000018 < 1) {
          if (*in_R8 < *in_R9) {
            *in_R9 = -0x80000000;
          }
          if (((in_RCX != (uint *)0x0) && (*in_RCX != 0)) &&
             ((*in_R8 < iVar7 || ((int)(iVar7 - in_stack_00000018) <= *in_R9)))) {
            *in_RCX = 0;
          }
          if (*in_R9 < iVar7) {
            *in_R9 = iVar7;
          }
        }
        else {
          if (*in_R9 < *in_R8) {
            *in_R9 = 0x7fffffff;
          }
          if (((in_RCX != (uint *)0x0) && (*in_RCX != 0)) &&
             ((iVar7 < *in_R8 || (*in_R9 <= (int)(iVar7 - in_stack_00000018))))) {
            *in_RCX = 0;
          }
          if (iVar7 < *in_R9) {
            *in_R9 = iVar7;
          }
        }
      }
    }
    else {
      if (uVar3 < local_3c) {
        iVar7 = *in_R8 + uVar3 * in_stack_00000018;
        *in_R8 = iVar7;
        *in_R9 = iVar7;
      }
      else {
        *in_R8 = *in_R9 + in_stack_00000018;
      }
      if (((in_RCX != (uint *)0x0) && (*in_RCX != 0)) && (uVar3 != uVar5)) {
        *in_RCX = 0;
      }
    }
  }
  else {
    __kmp_debug_assert((char *)CONCAT44(in_ESI,in_EDX),(char *)in_RCX,(int)((ulong)in_R8 >> 0x20));
  }
  return;
}

Assistant:

static void __kmp_dist_for_static_init(ident_t *loc, kmp_int32 gtid,
                                       kmp_int32 schedule, kmp_int32 *plastiter,
                                       T *plower, T *pupper, T *pupperDist,
                                       typename traits_t<T>::signed_t *pstride,
                                       typename traits_t<T>::signed_t incr,
                                       typename traits_t<T>::signed_t chunk) {
  KMP_COUNT_BLOCK(OMP_DISTRIBUTE);
  KMP_PUSH_PARTITIONED_TIMER(OMP_distribute);
  KMP_PUSH_PARTITIONED_TIMER(OMP_distribute_scheduling);
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  kmp_uint32 tid;
  kmp_uint32 nth;
  kmp_uint32 team_id;
  kmp_uint32 nteams;
  UT trip_count;
  kmp_team_t *team;
  kmp_info_t *th;

  KMP_DEBUG_ASSERT(plastiter && plower && pupper && pupperDist && pstride);
  KE_TRACE(10, ("__kmpc_dist_for_static_init called (%d)\n", gtid));
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmpc_dist_for_static_init: T#%%d schedLoop=%%d liter=%%d "
        "iter=(%%%s, %%%s, %%%s) chunk=%%%s signed?<%s>\n",
        traits_t<T>::spec, traits_t<T>::spec, traits_t<ST>::spec,
        traits_t<ST>::spec, traits_t<T>::spec);
    KD_TRACE(100,
             (buff, gtid, schedule, *plastiter, *plower, *pupper, incr, chunk));
    __kmp_str_free(&buff);
  }
#endif

  if (__kmp_env_consistency_check) {
    __kmp_push_workshare(gtid, ct_pdo, loc);
    if (incr == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited, ct_pdo,
                            loc);
    }
    if (incr > 0 ? (*pupper < *plower) : (*plower < *pupper)) {
      // The loop is illegal.
      // Some zero-trip loops maintained by compiler, e.g.:
      //   for(i=10;i<0;++i) // lower >= upper - run-time check
      //   for(i=0;i>10;--i) // lower <= upper - run-time check
      //   for(i=0;i>10;++i) // incr > 0       - compile-time check
      //   for(i=10;i<0;--i) // incr < 0       - compile-time check
      // Compiler does not check the following illegal loops:
      //   for(i=0;i<10;i+=incr) // where incr<0
      //   for(i=10;i>0;i-=incr) // where incr<0
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrIllegal, ct_pdo, loc);
    }
  }
  tid = __kmp_tid_from_gtid(gtid);
  th = __kmp_threads[gtid];
  nth = th->th.th_team_nproc;
  team = th->th.th_team;
  KMP_DEBUG_ASSERT(th->th.th_teams_microtask); // we are in the teams construct
  nteams = th->th.th_teams_size.nteams;
  team_id = team->t.t_master_tid;
  KMP_DEBUG_ASSERT(nteams == (kmp_uint32)team->t.t_parent->t.t_nproc);

  // compute global trip count
  if (incr == 1) {
    trip_count = *pupper - *plower + 1;
  } else if (incr == -1) {
    trip_count = *plower - *pupper + 1;
  } else if (incr > 0) {
    // upper-lower can exceed the limit of signed type
    trip_count = (UT)(*pupper - *plower) / incr + 1;
  } else {
    trip_count = (UT)(*plower - *pupper) / (-incr) + 1;
  }

  *pstride = *pupper - *plower; // just in case (can be unused)
  if (trip_count <= nteams) {
    KMP_DEBUG_ASSERT(
        __kmp_static == kmp_sch_static_greedy ||
        __kmp_static ==
            kmp_sch_static_balanced); // Unknown static scheduling type.
    // only masters of some teams get single iteration, other threads get
    // nothing
    if (team_id < trip_count && tid == 0) {
      *pupper = *pupperDist = *plower = *plower + team_id * incr;
    } else {
      *pupperDist = *pupper;
      *plower = *pupper + incr; // compiler should skip loop body
    }
    if (plastiter != NULL)
      *plastiter = (tid == 0 && team_id == trip_count - 1);
  } else {
    // Get the team's chunk first (each team gets at most one chunk)
    if (__kmp_static == kmp_sch_static_balanced) {
      UT chunkD = trip_count / nteams;
      UT extras = trip_count % nteams;
      *plower +=
          incr * (team_id * chunkD + (team_id < extras ? team_id : extras));
      *pupperDist = *plower + chunkD * incr - (team_id < extras ? 0 : incr);
      if (plastiter != NULL)
        *plastiter = (team_id == nteams - 1);
    } else {
      T chunk_inc_count =
          (trip_count / nteams + ((trip_count % nteams) ? 1 : 0)) * incr;
      T upper = *pupper;
      KMP_DEBUG_ASSERT(__kmp_static == kmp_sch_static_greedy);
      // Unknown static scheduling type.
      *plower += team_id * chunk_inc_count;
      *pupperDist = *plower + chunk_inc_count - incr;
      // Check/correct bounds if needed
      if (incr > 0) {
        if (*pupperDist < *plower)
          *pupperDist = traits_t<T>::max_value;
        if (plastiter != NULL)
          *plastiter = *plower <= upper && *pupperDist > upper - incr;
        if (*pupperDist > upper)
          *pupperDist = upper; // tracker C73258
        if (*plower > *pupperDist) {
          *pupper = *pupperDist; // no iterations available for the team
          goto end;
        }
      } else {
        if (*pupperDist > *plower)
          *pupperDist = traits_t<T>::min_value;
        if (plastiter != NULL)
          *plastiter = *plower >= upper && *pupperDist < upper - incr;
        if (*pupperDist < upper)
          *pupperDist = upper; // tracker C73258
        if (*plower < *pupperDist) {
          *pupper = *pupperDist; // no iterations available for the team
          goto end;
        }
      }
    }
    // Get the parallel loop chunk now (for thread)
    // compute trip count for team's chunk
    if (incr == 1) {
      trip_count = *pupperDist - *plower + 1;
    } else if (incr == -1) {
      trip_count = *plower - *pupperDist + 1;
    } else if (incr > 1) {
      // upper-lower can exceed the limit of signed type
      trip_count = (UT)(*pupperDist - *plower) / incr + 1;
    } else {
      trip_count = (UT)(*plower - *pupperDist) / (-incr) + 1;
    }
    KMP_DEBUG_ASSERT(trip_count);
    switch (schedule) {
    case kmp_sch_static: {
      if (trip_count <= nth) {
        KMP_DEBUG_ASSERT(
            __kmp_static == kmp_sch_static_greedy ||
            __kmp_static ==
                kmp_sch_static_balanced); // Unknown static scheduling type.
        if (tid < trip_count)
          *pupper = *plower = *plower + tid * incr;
        else
          *plower = *pupper + incr; // no iterations available
        if (plastiter != NULL)
          if (*plastiter != 0 && !(tid == trip_count - 1))
            *plastiter = 0;
      } else {
        if (__kmp_static == kmp_sch_static_balanced) {
          UT chunkL = trip_count / nth;
          UT extras = trip_count % nth;
          *plower += incr * (tid * chunkL + (tid < extras ? tid : extras));
          *pupper = *plower + chunkL * incr - (tid < extras ? 0 : incr);
          if (plastiter != NULL)
            if (*plastiter != 0 && !(tid == nth - 1))
              *plastiter = 0;
        } else {
          T chunk_inc_count =
              (trip_count / nth + ((trip_count % nth) ? 1 : 0)) * incr;
          T upper = *pupperDist;
          KMP_DEBUG_ASSERT(__kmp_static == kmp_sch_static_greedy);
          // Unknown static scheduling type.
          *plower += tid * chunk_inc_count;
          *pupper = *plower + chunk_inc_count - incr;
          if (incr > 0) {
            if (*pupper < *plower)
              *pupper = traits_t<T>::max_value;
            if (plastiter != NULL)
              if (*plastiter != 0 &&
                  !(*plower <= upper && *pupper > upper - incr))
                *plastiter = 0;
            if (*pupper > upper)
              *pupper = upper; // tracker C73258
          } else {
            if (*pupper > *plower)
              *pupper = traits_t<T>::min_value;
            if (plastiter != NULL)
              if (*plastiter != 0 &&
                  !(*plower >= upper && *pupper < upper - incr))
                *plastiter = 0;
            if (*pupper < upper)
              *pupper = upper; // tracker C73258
          }
        }
      }
      break;
    }
    case kmp_sch_static_chunked: {
      ST span;
      if (chunk < 1)
        chunk = 1;
      span = chunk * incr;
      *pstride = span * nth;
      *plower = *plower + (span * tid);
      *pupper = *plower + span - incr;
      if (plastiter != NULL)
        if (*plastiter != 0 && !(tid == ((trip_count - 1) / (UT)chunk) % nth))
          *plastiter = 0;
      break;
    }
    default:
      KMP_ASSERT2(0,
                  "__kmpc_dist_for_static_init: unknown loop scheduling type");
      break;
    }
  }
end:;
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmpc_dist_for_static_init: last=%%d lo=%%%s up=%%%s upDist=%%%s "
        "stride=%%%s signed?<%s>\n",
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec,
        traits_t<ST>::spec, traits_t<T>::spec);
    KD_TRACE(100, (buff, *plastiter, *plower, *pupper, *pupperDist, *pstride));
    __kmp_str_free(&buff);
  }
#endif
  KE_TRACE(10, ("__kmpc_dist_for_static_init: T#%d return\n", gtid));
  KMP_STATS_LOOP_END(OMP_distribute_iterations);
  return;
}